

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * sqlite3_filename_wal(char *zFilename)

{
  char *pcVar1;
  size_t sVar2;
  
  pcVar1 = sqlite3_filename_journal(zFilename);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    sVar2 = strlen(pcVar1);
    pcVar1 = pcVar1 + (ulong)((uint)sVar2 & 0x3fffffff) + 1;
  }
  return pcVar1;
}

Assistant:

SQLITE_API const char *sqlite3_filename_wal(const char *zFilename){
#ifdef SQLITE_OMIT_WAL
  return 0;
#else
  zFilename = sqlite3_filename_journal(zFilename);
  if( zFilename ) zFilename += sqlite3Strlen30(zFilename) + 1;
  return zFilename;
#endif
}